

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O2

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)

{
  loadedModule = (void *)0x0;
  vkGetInstanceProcAddr = handler;
  vkCreateInstance = (PFN_vkCreateInstance)(*handler)((VkInstance)0x0,"vkCreateInstance");
  vkEnumerateInstanceExtensionProperties =
       (PFN_vkEnumerateInstanceExtensionProperties)
       (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceExtensionProperties");
  vkEnumerateInstanceLayerProperties =
       (PFN_vkEnumerateInstanceLayerProperties)
       (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceLayerProperties");
  vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)
       (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceVersion");
  return;
}

Assistant:

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)
{
	vkGetInstanceProcAddr = handler;

	loadedModule = NULL;
	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);
}